

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemTxResult
address_space_read_full_m68k(AddressSpace *as,hwaddr addr,MemTxAttrs attrs,void *buf,hwaddr len)

{
  MemTxResult MVar1;
  
  if (len != 0) {
    MVar1 = flatview_read((uc_struct_conflict3 *)as->uc,as->current_map,addr,attrs,buf,len);
    return MVar1;
  }
  return 0;
}

Assistant:

MemTxResult address_space_read_full(AddressSpace *as, hwaddr addr,
                                    MemTxAttrs attrs, void *buf, hwaddr len)
{
    MemTxResult result = MEMTX_OK;
    FlatView *fv;

    if (len > 0) {
        fv = address_space_to_flatview(as);
        result = flatview_read(as->uc, fv, addr, attrs, buf, len);
    }

    return result;
}